

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  bool bVar1;
  undefined8 uVar2;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  int iVar4;
  long lVar5;
  ulong unaff_RBP;
  cpp_dec_float<100U,_int,_void> *pcVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  cpp_dec_float<100U,_int,_void> local_1a8;
  cpp_dec_float<100U,_int,_void> *local_158;
  uint local_14c;
  cpp_dec_float<100U,_int,_void> local_148;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_f0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d8;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if ((this->_hasSolReal != true) ||
     (unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1), ((this->_solReal).field_0xe0 & 1) == 0)) {
    if (this->_hasSolRational == true) {
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),(this->_solRational).field_0xd0) &
                  0xffffffffffffff01;
    }
    else {
      unaff_RBP = 0;
    }
  }
  if ((char)unaff_RBP != '\0') {
    local_158 = &sumviol->m_backend;
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_f0,
                 (this->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x46])(this->_realLP,&this->_solReal,&local_f0,1);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
    local_14c = (uint)unaff_RBP;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_158,0.0);
    lVar5 = (long)(this->_realLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    local_d8 = this;
    if (0 < lVar5) {
      lVar7 = lVar5 * 0x50;
      do {
        pSVar3 = local_d8;
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_d0,local_d8->_realLP,(int)(lVar5 + -1));
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_80,pSVar3->_realLP,(int)lVar5 + -1);
        pcVar6 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)local_f0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar7);
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 0x10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems[6] = 0;
        local_1a8.data._M_elems[7] = 0;
        local_1a8.data._M_elems[8] = 0;
        local_1a8.data._M_elems[9] = 0;
        local_1a8.data._M_elems[10] = 0;
        local_1a8.data._M_elems[0xb] = 0;
        local_1a8.data._M_elems[0xc] = 0;
        local_1a8.data._M_elems[0xd] = 0;
        local_1a8.data._M_elems._56_5_ = 0;
        local_1a8.data._M_elems[0xf]._1_3_ = 0;
        local_1a8.exp = 0;
        local_1a8.neg = false;
        if (pcVar6 == &local_1a8) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1a8,&local_d0);
          if (local_1a8.data._M_elems[0] != 0 || local_1a8.fpclass != cpp_dec_float_finite) {
            local_1a8.neg = (bool)(local_1a8.neg ^ 1);
          }
        }
        else {
          local_1a8.data._M_elems[0xc] = local_d0.data._M_elems[0xc];
          local_1a8.data._M_elems[0xd] = local_d0.data._M_elems[0xd];
          local_1a8.data._M_elems._56_5_ = local_d0.data._M_elems._56_5_;
          local_1a8.data._M_elems[0xf]._1_3_ = local_d0.data._M_elems[0xf]._1_3_;
          local_1a8.data._M_elems[8] = local_d0.data._M_elems[8];
          local_1a8.data._M_elems[9] = local_d0.data._M_elems[9];
          local_1a8.data._M_elems[10] = local_d0.data._M_elems[10];
          local_1a8.data._M_elems[0xb] = local_d0.data._M_elems[0xb];
          local_1a8.data._M_elems[4] = local_d0.data._M_elems[4];
          local_1a8.data._M_elems[5] = local_d0.data._M_elems[5];
          local_1a8.data._M_elems[6] = local_d0.data._M_elems[6];
          local_1a8.data._M_elems[7] = local_d0.data._M_elems[7];
          local_1a8.data._M_elems[0] = local_d0.data._M_elems[0];
          local_1a8.data._M_elems[1] = local_d0.data._M_elems[1];
          local_1a8.data._M_elems[2] = local_d0.data._M_elems[2];
          local_1a8.data._M_elems[3] = local_d0.data._M_elems[3];
          local_1a8.exp = local_d0.exp;
          local_1a8.neg = local_d0.neg;
          local_1a8.fpclass = local_d0.fpclass;
          local_1a8.prec_elem = local_d0.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1a8,pcVar6);
        }
        if (local_1a8.fpclass != cpp_dec_float_NaN) {
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x10;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems._56_5_ = 0;
          local_148.data._M_elems[0xf]._1_3_ = 0;
          local_148.exp = 0;
          local_148.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_148,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_1a8,&local_148);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_158,&local_1a8);
            if ((local_1a8.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1a8,&maxviol->m_backend);
              if (0 < iVar4) {
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) =
                     local_1a8.data._M_elems._48_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
                     CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                     local_1a8.data._M_elems._32_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) =
                     local_1a8.data._M_elems._40_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_1a8.data._M_elems._16_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) =
                     local_1a8.data._M_elems._24_8_;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_1a8.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_1a8.exp;
                (maxviol->m_backend).neg = local_1a8.neg;
                (maxviol->m_backend).fpclass = local_1a8.fpclass;
                (maxviol->m_backend).prec_elem = local_1a8.prec_elem;
              }
            }
          }
        }
        pcVar6 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)local_f0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar7);
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems._56_5_ = 0;
        local_148.data._M_elems[0xf]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        if (pcVar6 != &local_148) {
          local_148.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
          local_148.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
          local_148.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
          local_148.data._M_elems._24_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 6);
          local_148.data._M_elems._32_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 8);
          local_148.data._M_elems._40_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 10);
          local_148.data._M_elems._48_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 0xc);
          uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 0xe);
          local_148.data._M_elems._56_5_ = SUB85(uVar2,0);
          local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_148.exp =
               *(int *)((long)(&local_f0.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                       lVar7);
          local_148.neg =
               *(bool *)((long)(&local_f0.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                        lVar7 + 4);
          local_148._72_8_ =
               *(undefined8 *)
                ((long)(&local_f0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                lVar7 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_148,&local_80);
        local_1a8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
        local_1a8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
        local_1a8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
        local_1a8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
        local_1a8.data._M_elems[8] = local_148.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_148.data._M_elems[9];
        local_1a8.data._M_elems[10] = local_148.data._M_elems[10];
        local_1a8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
        local_1a8.data._M_elems[4] = local_148.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_148.data._M_elems[5];
        local_1a8.data._M_elems[6] = local_148.data._M_elems[6];
        local_1a8.data._M_elems[7] = local_148.data._M_elems[7];
        local_1a8.data._M_elems[0] = local_148.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_148.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_148.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_148.data._M_elems[3];
        local_1a8.exp = local_148.exp;
        local_1a8.neg = local_148.neg;
        local_1a8.fpclass = local_148.fpclass;
        local_1a8.prec_elem = local_148.prec_elem;
        if (local_148.fpclass != cpp_dec_float_NaN) {
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x10;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems._56_5_ = 0;
          local_148.data._M_elems[0xf]._1_3_ = 0;
          local_148.exp = 0;
          local_148.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_148,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_1a8,&local_148);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_158,&local_1a8);
            if ((local_1a8.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1a8,&maxviol->m_backend);
              if (0 < iVar4) {
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) =
                     local_1a8.data._M_elems._48_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
                     CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                     local_1a8.data._M_elems._32_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) =
                     local_1a8.data._M_elems._40_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_1a8.data._M_elems._16_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) =
                     local_1a8.data._M_elems._24_8_;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_1a8.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_1a8.exp;
                (maxviol->m_backend).neg = local_1a8.neg;
                (maxviol->m_backend).fpclass = local_1a8.fpclass;
                (maxviol->m_backend).prec_elem = local_1a8.prec_elem;
              }
            }
          }
        }
        bVar1 = 1 < lVar5;
        lVar5 = lVar5 + -1;
        lVar7 = lVar7 + -0x50;
      } while (bVar1);
    }
    if (local_f0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    unaff_RBP = (ulong)local_14c;
  }
  return (bool)(char)unaff_RBP;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}